

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::safe_strto64(string *str,int64 *value)

{
  bool bVar1;
  string *in_RDI;
  long *unaff_retaddr;
  string *in_stack_00000008;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RDI);
  bVar1 = safe_int_internal<long>(in_stack_00000008,unaff_retaddr);
  std::__cxx11::string::~string(local_30);
  return bVar1;
}

Assistant:

bool safe_strto64(const string& str, int64* value) {
  return safe_int_internal(str, value);
}